

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Ch *pCVar2;
  Ch *pCVar3;
  bool bVar4;
  MemoryStream *pMVar5;
  long lVar6;
  byte *pbVar8;
  uint count;
  byte bVar9;
  ulong uVar10;
  Member *members;
  StreamLocalCopy<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_0>
  copy;
  char *pcVar7;
  
  pMVar5 = is->is_;
  if (pMVar5->src_ != pMVar5->end_) {
    pMVar5->src_ = pMVar5->src_ + 1;
  }
  bVar4 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::StartObject(handler);
  pMVar5 = is->is_;
  if (!bVar4) {
    pCVar2 = pMVar5->src_;
    pCVar3 = pMVar5->begin_;
    *(undefined4 *)(this + 0x30) = 0x10;
    *(long *)(this + 0x38) = (long)pCVar2 - (long)pCVar3;
    return;
  }
  pbVar8 = (byte *)pMVar5->src_;
  pbVar1 = (byte *)pMVar5->end_;
  do {
    if (pbVar8 == pbVar1) {
      uVar10 = 0;
    }
    else {
      uVar10 = (ulong)*pbVar8;
    }
    do {
      if ((0x20 < (byte)uVar10) || ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0)) {
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pbVar8 = (byte *)pMVar5->src_;
        if (pbVar8 == pbVar1) {
          bVar4 = false;
        }
        else {
          bVar4 = *pbVar8 == 0x7d;
        }
        if (bVar4) {
          if (pbVar8 != pbVar1) {
            pMVar5->src_ = (Ch *)(pbVar8 + 1);
          }
          if (bVar4) {
            pcVar7 = (handler->stack_).stackTop_;
            pcVar7[-8] = '\0';
            pcVar7[-7] = '\0';
            pcVar7[-6] = '\0';
            pcVar7[-5] = '\0';
            pcVar7[-4] = '\0';
            pcVar7[-3] = '\0';
            pcVar7[-2] = '\x03';
            pcVar7[-1] = '\0';
            pcVar7[-0x10] = '\0';
            pcVar7[-0xf] = '\0';
            pcVar7[-0xe] = '\0';
            pcVar7[-0xd] = '\0';
            pcVar7[-0xc] = '\0';
            pcVar7[-0xb] = '\0';
            pcVar7[-10] = '\0';
            pcVar7[-9] = '\0';
            return;
          }
        }
        pMVar5 = is->is_;
        pcVar7 = pMVar5->src_;
        if ((pcVar7 == pMVar5->end_) || (*pcVar7 != '\"')) {
LAB_00103179:
          lVar6 = (long)pcVar7 - (long)pMVar5->begin_;
          *(undefined4 *)(this + 0x30) = 4;
LAB_00103194:
          *(long *)(this + 0x38) = lVar6;
          return;
        }
        count = 0;
LAB_00102f98:
        ParseString<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler,true);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pMVar5 = is->is_;
        pbVar8 = (byte *)pMVar5->src_;
        pbVar1 = (byte *)pMVar5->end_;
        do {
          if (pbVar8 == pbVar1) {
            uVar10 = 0;
          }
          else {
            uVar10 = (ulong)*pbVar8;
          }
          do {
            if ((0x20 < (byte)uVar10) || ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0)) {
              pbVar8 = (byte *)pMVar5->src_;
              if (pbVar8 == pbVar1) {
                bVar4 = false;
              }
              else {
                bVar4 = *pbVar8 == 0x3a;
              }
              if (bVar4) {
                if (pbVar8 != pbVar1) {
                  pMVar5->src_ = (Ch *)(pbVar8 + 1);
                }
                if (bVar4) {
                  pbVar8 = (byte *)pMVar5->src_;
                  goto LAB_0010301b;
                }
              }
              lVar6 = (long)pMVar5->src_ - (long)pMVar5->begin_;
              *(undefined4 *)(this + 0x30) = 5;
              goto LAB_00103194;
            }
            uVar10 = 0;
          } while (pbVar8 == pbVar1);
          pbVar8 = pbVar8 + 1;
          pMVar5->src_ = (Ch *)pbVar8;
        } while( true );
      }
      uVar10 = 0;
    } while (pbVar8 == pbVar1);
    pbVar8 = pbVar8 + 1;
    pMVar5->src_ = (Ch *)pbVar8;
  } while( true );
LAB_0010301b:
  if (pbVar8 == pbVar1) {
    uVar10 = 0;
  }
  else {
    uVar10 = (ulong)*pbVar8;
  }
  do {
    if ((0x20 < (byte)uVar10) || ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0)) {
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      pMVar5 = is->is_;
      pbVar8 = (byte *)pMVar5->src_;
      pbVar1 = (byte *)pMVar5->end_;
      goto LAB_00103072;
    }
    uVar10 = 0;
  } while (pbVar8 == pbVar1);
  pbVar8 = pbVar8 + 1;
  pMVar5->src_ = (Ch *)pbVar8;
  goto LAB_0010301b;
LAB_00103072:
  if (pbVar8 == pbVar1) {
    uVar10 = 0;
  }
  else {
    uVar10 = (ulong)*pbVar8;
  }
  do {
    if ((0x20 < (byte)uVar10) || ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0)) {
      pbVar8 = (byte *)pMVar5->src_;
      if (pbVar8 == pbVar1) {
        bVar9 = 0;
      }
      else {
        bVar9 = *pbVar8;
      }
      count = count + 1;
      if (bVar9 != 0x2c) {
        if (bVar9 != 0x7d) {
          pCVar2 = pMVar5->begin_;
          *(undefined4 *)(this + 0x30) = 6;
          *(long *)(this + 0x38) = (long)pbVar8 - (long)pCVar2;
          return;
        }
        if (pbVar8 != pbVar1) {
          pMVar5->src_ = (Ch *)(pbVar8 + 1);
        }
        allocator = handler->allocator_;
        pcVar7 = (handler->stack_).stackTop_;
        members = (Member *)(pcVar7 + (ulong)count * -0x20);
        (handler->stack_).stackTop_ = (char *)members;
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::SetObjectRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)(pcVar7 + (ulong)count * -0x20 + -0x10),members,count,allocator);
        return;
      }
      if (pbVar8 != pbVar1) {
        pMVar5->src_ = (Ch *)(pbVar8 + 1);
      }
      pbVar8 = (byte *)pMVar5->src_;
      goto LAB_001030be;
    }
    uVar10 = 0;
  } while (pbVar8 == pbVar1);
  pbVar8 = pbVar8 + 1;
  pMVar5->src_ = (Ch *)pbVar8;
  goto LAB_00103072;
LAB_001030be:
  if (pbVar8 == pbVar1) {
    uVar10 = 0;
  }
  else {
    uVar10 = (ulong)*pbVar8;
  }
  do {
    if ((0x20 < (byte)uVar10) || ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0)) {
      pMVar5 = is->is_;
      pcVar7 = pMVar5->src_;
      if ((pcVar7 == pMVar5->end_) || (*pcVar7 != '\"')) goto LAB_00103179;
      goto LAB_00102f98;
    }
    uVar10 = 0;
  } while (pbVar8 == pbVar1);
  pbVar8 = pbVar8 + 1;
  pMVar5->src_ = (Ch *)pbVar8;
  goto LAB_001030be;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '{');
        is.Take();  // Skip '{'

        if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, '}')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType memberCount = 0;;) {
            if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

            ParseString<parseFlags>(is, handler, true);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++memberCount;

            switch (is.Peek()) {
                case ',':
                    is.Take();
                    SkipWhitespaceAndComments<parseFlags>(is);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    break;
                case '}':
                    is.Take();
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    return;
                default:
                    RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
            }

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == '}') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }